

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void stbi__setup_jpeg(stbi__jpeg *j)

{
  int iVar1;
  long in_RDI;
  
  *(code **)(in_RDI + 0x4870) = stbi__idct_block;
  *(code **)(in_RDI + 0x4878) = stbi__YCbCr_to_RGB_row;
  *(code **)(in_RDI + 0x4880) = stbi__resample_row_hv_2;
  iVar1 = stbi__sse2_available();
  if (iVar1 != 0) {
    *(code **)(in_RDI + 0x4870) = stbi__idct_simd;
    *(code **)(in_RDI + 0x4878) = stbi__YCbCr_to_RGB_simd;
    *(code **)(in_RDI + 0x4880) = stbi__resample_row_hv_2_simd;
  }
  return;
}

Assistant:

static void stbi__setup_jpeg(stbi__jpeg *j)
{
   j->idct_block_kernel = stbi__idct_block;
   j->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_row;
   j->resample_row_hv_2_kernel = stbi__resample_row_hv_2;

#ifdef STBI_SSE2
   if (stbi__sse2_available()) {
      j->idct_block_kernel = stbi__idct_simd;
      j->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
      j->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
   }
#endif

#ifdef STBI_NEON
   j->idct_block_kernel = stbi__idct_simd;
   j->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
   j->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
#endif
}